

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall wasm::Thread::~Thread(Thread *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Thread *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex);
  this->done = true;
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->(&this->thread);
  std::thread::join();
  std::function<wasm::ThreadWorkState_()>::~function(&this->doWork);
  std::condition_variable::~condition_variable(&this->condition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->thread);
  return;
}

Assistant:

Thread::~Thread() {
  {
    std::lock_guard<std::mutex> lock(mutex);
    // notify the thread that it can exit
    done = true;
    condition.notify_one();
  }
  thread->join();
}